

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Stress::anon_unknown_0::TextureCase::deinit(TextureCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  RenderCase::deinit(&this->super_RenderCase);
  if (this->m_textureID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_textureID);
    this->m_textureID = 0;
  }
  if (this->m_pboID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_pboID);
    this->m_pboID = 0;
  }
  return;
}

Assistant:

void TextureCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderCase::deinit();

	if (m_textureID)
	{
		gl.deleteTextures(1, &m_textureID);
		m_textureID = 0;
	}
	if (m_pboID)
	{
		gl.deleteBuffers(1, &m_pboID);
		m_pboID = 0;
	}
}